

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_settings.cpp
# Opt level: O3

void duckdb::DuckDBSettingsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  GlobalTableFunctionState *pGVar2;
  pointer pcVar3;
  reference pvVar4;
  _func_int **__n;
  ulong index;
  bool bVar5;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
              (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5) * -0x3333333333333333)) {
    index = 0;
    do {
      pGVar2[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar4 = vector<duckdb::DuckDBSettingValue,_true>::operator[]
                         ((vector<duckdb::DuckDBSettingValue,_true> *)(pGVar2 + 1),(size_type)__n);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar3 = (pvVar4->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + (pvVar4->name)._M_string_length);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (pvVar4->value)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + (pvVar4->value)._M_string_length);
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (pvVar4->description)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (pvVar4->description)._M_string_length);
      Value::Value(&local_70,&local_d0);
      DataChunk::SetValue(output,2,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar3 = (pvVar4->input_type)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + (pvVar4->input_type)._M_string_length);
      Value::Value(&local_70,&local_f0);
      DataChunk::SetValue(output,3,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar3 = (pvVar4->scope)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (pvVar4->scope)._M_string_length);
      Value::Value(&local_70,&local_110);
      DataChunk::SetValue(output,4,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      iVar1 = index + 1;
      __n = pGVar2[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar2[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5) * -0x3333333333333333))
            && (bVar5 = index < 0x7ff, index = iVar1, bVar5));
    output->count = iVar1;
  }
  return;
}

Assistant:

void DuckDBSettingsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSettingsData>();
	if (data.offset >= data.settings.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.settings.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.settings[data.offset++];

		// return values:
		// name, LogicalType::VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// value, LogicalType::VARCHAR
		output.SetValue(1, count, Value(entry.value));
		// description, LogicalType::VARCHAR
		output.SetValue(2, count, Value(entry.description));
		// input_type, LogicalType::VARCHAR
		output.SetValue(3, count, Value(entry.input_type));
		// scope, LogicalType::VARCHAR
		output.SetValue(4, count, Value(entry.scope));
		count++;
	}
	output.SetCardinality(count);
}